

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replacement_scan.hpp
# Opt level: O2

bool duckdb::ReplacementScan::CanReplace
               (string *table_name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *extensions)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  FileCompressionType type;
  FileCompressionType type_00;
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  string lower_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  StringUtil::Lower(&lower_name,table_name);
  CompressionExtensionFromType_abi_cxx11_(&sStack_b8,(duckdb *)0x2,type);
  bVar2 = StringUtil::EndsWith(&lower_name,&sStack_b8);
  ::std::__cxx11::string::~string((string *)&sStack_b8);
  if (bVar2) {
    ::std::__cxx11::string::substr((ulong)&sStack_b8,(ulong)&lower_name);
  }
  else {
    CompressionExtensionFromType_abi_cxx11_(&sStack_b8,(duckdb *)0x3,type_00);
    bVar2 = StringUtil::EndsWith(&lower_name,&sStack_b8);
    ::std::__cxx11::string::~string((string *)&sStack_b8);
    if (!bVar2) goto LAB_006719df;
    ::std::__cxx11::string::substr((ulong)&sStack_b8,(ulong)&lower_name);
  }
  ::std::__cxx11::string::operator=((string *)&lower_name,(string *)&sStack_b8);
  ::std::__cxx11::string::~string((string *)&sStack_b8);
LAB_006719df:
  local_98 = (extensions->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = (extensions->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    __rhs = pbVar1;
    if (__rhs == local_98) break;
    ::std::operator+(&sStack_b8,".",__rhs);
    bVar2 = StringUtil::EndsWith(&lower_name,&sStack_b8);
    if (bVar2) {
      ::std::__cxx11::string::~string((string *)&sStack_b8);
      break;
    }
    ::std::operator+(&local_70,".",__rhs);
    ::std::operator+(&local_50,&local_70,"?");
    bVar2 = StringUtil::Contains(&lower_name,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&sStack_b8);
    pbVar1 = __rhs + 1;
  } while (!bVar2);
  bVar2 = __rhs != local_98;
  ::std::__cxx11::string::~string((string *)&lower_name);
  return bVar2;
}

Assistant:

static bool CanReplace(const string &table_name, const vector<string> &extensions) {
		auto lower_name = StringUtil::Lower(table_name);

		if (StringUtil::EndsWith(lower_name, CompressionExtensionFromType(FileCompressionType::GZIP))) {
			lower_name = lower_name.substr(0, lower_name.size() - 3);
		} else if (StringUtil::EndsWith(lower_name, CompressionExtensionFromType(FileCompressionType::ZSTD))) {
			lower_name = lower_name.substr(0, lower_name.size() - 4);
		}

		for (auto &extension : extensions) {
			if (StringUtil::EndsWith(lower_name, "." + extension) ||
			    StringUtil::Contains(lower_name, "." + extension + "?")) {
				return true;
			}
		}

		return false;
	}